

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBase.cpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseResourcesBaseInstance::createDeviceSupportingQueues
          (SparseResourcesBaseInstance *this,QueueRequirementsVec *queueRequirements)

{
  Move<vk::VkDevice_s_*> *this_00;
  MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *this_01;
  pointer pQVar1;
  VkDevice device;
  PtrData<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> data;
  PtrData<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> data_00;
  VkAllocationCallbacks *pVVar2;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  mapped_type *pmVar5;
  mapped_type *this_02;
  mapped_type *this_03;
  _Base_ptr p_Var6;
  DeviceDriver *pDVar7;
  SimpleAllocator *this_04;
  VkQueue pVVar8;
  _Rb_tree_node_base *p_Var9;
  NotSupportedError *this_05;
  ResourceError *pRVar10;
  uint uVar11;
  ulong uVar12;
  deUint32 queueNdx_1;
  deUint32 dVar13;
  uint uVar14;
  uint uVar15;
  deUint32 queueNdx;
  deUint32 dVar17;
  undefined4 uStack_450;
  deUint32 queueFamilyPropertiesCount;
  InstanceInterface *local_448;
  uint local_43c;
  RefBase<vk::VkDevice_s_*> local_438;
  VkPhysicalDevice local_420;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  SelectedQueuesMap selectedQueueFamilies;
  QueuePrioritiesMap queuePriorities;
  Queue queue;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkDeviceCreateInfo deviceInfo;
  uint uVar16;
  
  pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  queueFamilyPropertiesCount = 0;
  (*pIVar3->_vptr_InstanceInterface[6])(pIVar3,pVVar4,&queueFamilyPropertiesCount,0);
  if ((ulong)queueFamilyPropertiesCount == 0) {
    pRVar10 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar10,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x4c);
    __cxa_throw(pRVar10,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueFamilyProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
            (&queueFamilyProperties,(ulong)queueFamilyPropertiesCount);
  (*pIVar3->_vptr_InstanceInterface[6])
            (pIVar3,pVVar4,&queueFamilyPropertiesCount,
             queueFamilyProperties.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_448 = pIVar3;
  local_420 = pVVar4;
  if (queueFamilyPropertiesCount == 0) {
    pRVar10 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar10,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x54);
    __cxa_throw(pRVar10,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header;
  selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header;
  queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar11 = 0;
  selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       queuePriorities._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pQVar1 = (queueRequirements->
             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(queueRequirements->
                      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar1 >> 3) <=
        (ulong)uVar11) {
      queueInfos.
      super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      queueInfos.
      super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      queueInfos.
      super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (p_Var6 = selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pVVar4 = local_420, pIVar3 = local_448,
          (_Rb_tree_header *)p_Var6 != &selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        for (uVar11 = 0; uVar11 < *(uint *)&p_Var6[1].field_0x4; uVar11 = uVar11 + 1) {
          this_03 = std::
                    map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[](&queuePriorities,&p_Var6[1]._M_color);
          queue.queueHandle = (VkQueue)CONCAT44(queue.queueHandle._4_4_,0x3f800000);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_03,(float *)&queue);
        }
        queue.queueHandle = (VkQueue)CONCAT44(queue.queueHandle._4_4_,2);
        queue.queueFamilyIndex = 0;
        queue.queueIndex = 0;
        std::
        map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::operator[](&queuePriorities,&p_Var6[1]._M_color);
        std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
        push_back(&queueInfos,(value_type *)&queue);
      }
      ::vk::getPhysicalDeviceFeatures(&deviceFeatures,local_448,local_420);
      deviceInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
      deviceInfo.pNext = (void *)0x0;
      deviceInfo.flags = 0;
      deviceInfo.queueCreateInfoCount =
           (deUint32)
           (((long)queueInfos.
                   super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)queueInfos.
                  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      deviceInfo.pQueueCreateInfos =
           queueInfos.
           super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      deviceInfo.enabledLayerCount = 0;
      deviceInfo.ppEnabledLayerNames = (char **)0x0;
      deviceInfo.enabledExtensionCount = 0;
      deviceInfo.ppEnabledExtensionNames = (char **)0x0;
      deviceInfo.pEnabledFeatures = &deviceFeatures;
      ::vk::createDevice((Move<vk::VkDevice_s_*> *)&local_438,pIVar3,pVVar4,&deviceInfo,
                         (VkAllocationCallbacks *)0x0);
      pVVar2 = local_438.m_data.deleter.m_allocator;
      queue.queueHandle = (VkQueue)local_438.m_data.object;
      queue._8_8_ = local_438.m_data.deleter.m_destroyDevice;
      local_438.m_data.object = (VkDevice_s *)0x0;
      local_438.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
      local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      this_00 = &this->m_logicalDevice;
      ::vk::refdetails::RefBase<vk::VkDevice_s_*>::reset(&this_00->super_RefBase<vk::VkDevice_s_*>);
      (this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar2;
      (this_00->super_RefBase<vk::VkDevice_s_*>).m_data.object = (VkDevice_s *)queue.queueHandle;
      (this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)queue._8_8_;
      ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_438);
      pDVar7 = (DeviceDriver *)operator_new(0x4b8);
      ::vk::DeviceDriver::DeviceDriver
                (pDVar7,local_448,(this_00->super_RefBase<vk::VkDevice_s_*>).m_data.object);
      queue.queueHandle = (VkQueue)0x0;
      this_01 = &this->m_deviceDriver;
      data._8_4_ = uStack_450;
      data.ptr = (DeviceDriver *)this;
      data._12_4_ = queueFamilyPropertiesCount;
      de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::assignData
                (&this_01->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                 ,data);
      de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::~UniqueBase
                ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&queue);
      this_04 = (SimpleAllocator *)operator_new(0x220);
      pDVar7 = (this_01->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>).
               m_data.ptr;
      device = (this_00->super_RefBase<vk::VkDevice_s_*>).m_data.object;
      ::vk::getPhysicalDeviceMemoryProperties
                ((VkPhysicalDeviceMemoryProperties *)&queue,local_448,local_420);
      ::vk::SimpleAllocator::SimpleAllocator
                (this_04,&pDVar7->super_DeviceInterface,device,
                 (VkPhysicalDeviceMemoryProperties *)&queue);
      local_438.m_data.object = (VkDevice_s *)0x0;
      data_00._8_4_ = uStack_450;
      data_00.ptr = (Allocator *)this;
      data_00._12_4_ = queueFamilyPropertiesCount;
      de::details::UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::assignData
                (&(this->m_allocator).
                  super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>,data_00);
      de::details::UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::~UniqueBase
                ((UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)&local_438);
      for (p_Var9 = (this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(this->m_queues)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        uVar11 = 0;
        while( true ) {
          uVar12 = (ulong)uVar11;
          p_Var6 = p_Var9[1]._M_parent;
          if ((ulong)((long)p_Var9[1]._M_left - (long)p_Var6 >> 4) <= uVar12) break;
          pVVar8 = ::vk::getDeviceQueue
                             (&((this_01->
                                super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                                ).m_data.ptr)->super_DeviceInterface,
                              (this_00->super_RefBase<vk::VkDevice_s_*>).m_data.object,
                              *(deUint32 *)(&p_Var6->_M_parent + uVar12 * 2),
                              *(deUint32 *)((long)&p_Var6->_M_parent + uVar12 * 0x10 + 4));
          *(VkQueue *)(&p_Var6->_M_color + uVar12 * 4) = pVVar8;
          uVar11 = uVar11 + 1;
        }
      }
      std::_Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
      ~_Vector_base(&queueInfos.
                     super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                   );
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::~_Rb_tree(&queuePriorities._M_t);
      std::
      map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
      ::~map(&selectedQueueFamilies);
      std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
      ~_Vector_base(&queueFamilyProperties.
                     super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   );
      return;
    }
    pQVar1 = pQVar1 + uVar11;
    uVar15 = 0;
    uVar14 = 0;
    do {
      do {
        uVar16 = uVar15;
        uVar15 = uVar16 + 1;
        uVar12 = (ulong)uVar16;
        if ((ulong)(((long)queueFamilyProperties.
                           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)queueFamilyProperties.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar12)
        goto LAB_006e8df2;
      } while ((pQVar1->queueFlags &
               ~queueFamilyProperties.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar12].queueFlags) != 0);
      deviceFeatures.robustBufferAccess = uVar16;
      if (uVar15 == 0) {
LAB_006e8df2:
        this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_05,"No match found for queue requirements",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
                   ,0x65);
        __cxa_throw(this_05,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      dVar13 = pQVar1->queueCount - uVar14;
      if ((int)queueFamilyProperties.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].queueCount < (int)dVar13) {
        dVar13 = queueFamilyProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].queueCount;
      }
      local_43c = uVar14;
      pmVar5 = std::
               map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
               ::operator[](&selectedQueueFamilies,&deviceFeatures.robustBufferAccess);
      dVar17 = pmVar5->queueCount;
      pmVar5 = std::
               map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
               ::operator[](&selectedQueueFamilies,&deviceFeatures.robustBufferAccess);
      if ((int)dVar17 < (int)dVar13) {
        dVar17 = dVar13;
      }
      pmVar5->queueCount = dVar17;
      for (dVar17 = 0; dVar13 != dVar17; dVar17 = dVar17 + 1) {
        queue.queueIndex = dVar17;
        queue.queueFamilyIndex = uVar16;
        this_02 = std::
                  map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
                  ::operator[](&this->m_queues,&pQVar1->queueFlags);
        std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>::push_back
                  (this_02,&queue);
      }
      uVar14 = local_43c + dVar13;
      deviceFeatures.robustBufferAccess = uVar15;
    } while (uVar14 < pQVar1->queueCount);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void SparseResourcesBaseInstance::createDeviceSupportingQueues(const QueueRequirementsVec& queueRequirements)
{
	typedef std::map<vk::VkQueueFlags, std::vector<Queue> >		QueuesMap;
	typedef std::map<deUint32, QueueFamilyQueuesCount>			SelectedQueuesMap;
	typedef std::map<deUint32, std::vector<float> >				QueuePrioritiesMap;

	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	deUint32 queueFamilyPropertiesCount = 0u;
	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, DE_NULL);

	if(queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	std::vector<VkQueueFamilyProperties> queueFamilyProperties;
	queueFamilyProperties.resize(queueFamilyPropertiesCount);

	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, &queueFamilyProperties[0]);

	if (queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	SelectedQueuesMap	selectedQueueFamilies;
	QueuePrioritiesMap	queuePriorities;

	for (deUint32 queueReqNdx = 0; queueReqNdx < queueRequirements.size(); ++queueReqNdx)
	{
		const QueueRequirements& queueRequirement = queueRequirements[queueReqNdx];

		deUint32 queueFamilyIndex	= 0u;
		deUint32 queuesFoundCount	= 0u;

		do
		{
			queueFamilyIndex = findMatchingQueueFamilyIndex(queueFamilyProperties, queueRequirement.queueFlags, queueFamilyIndex);

			if (queueFamilyIndex == NO_MATCH_FOUND)
				TCU_THROW(NotSupportedError, "No match found for queue requirements");

			const deUint32 queuesPerFamilyCount = deMin32(queueFamilyProperties[queueFamilyIndex].queueCount, queueRequirement.queueCount - queuesFoundCount);

			selectedQueueFamilies[queueFamilyIndex].queueCount = deMax32(queuesPerFamilyCount, selectedQueueFamilies[queueFamilyIndex].queueCount);

			for (deUint32 queueNdx = 0; queueNdx < queuesPerFamilyCount; ++queueNdx)
			{
				Queue queue;
				queue.queueFamilyIndex	= queueFamilyIndex;
				queue.queueIndex		= queueNdx;

				m_queues[queueRequirement.queueFlags].push_back(queue);
			}

			queuesFoundCount += queuesPerFamilyCount;

			++queueFamilyIndex;
		} while (queuesFoundCount < queueRequirement.queueCount);
	}

	std::vector<VkDeviceQueueCreateInfo> queueInfos;

	for (SelectedQueuesMap::iterator queueFamilyIter = selectedQueueFamilies.begin(); queueFamilyIter != selectedQueueFamilies.end(); ++queueFamilyIter)
	{
		for (deUint32 queueNdx = 0; queueNdx < queueFamilyIter->second.queueCount; ++queueNdx)
			queuePriorities[queueFamilyIter->first].push_back(1.0f);

		const VkDeviceQueueCreateInfo queueInfo =
		{
			VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,		// VkStructureType             sType;
			DE_NULL,										// const void*                 pNext;
			(VkDeviceQueueCreateFlags)0u,					// VkDeviceQueueCreateFlags    flags;
			queueFamilyIter->first,							// uint32_t                    queueFamilyIndex;
			queueFamilyIter->second.queueCount,				// uint32_t                    queueCount;
			&queuePriorities[queueFamilyIter->first][0],	// const float*                pQueuePriorities;
		};

		queueInfos.push_back(queueInfo);
	}

	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);
	const VkDeviceCreateInfo		deviceInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,		// VkStructureType                    sType;
		DE_NULL,									// const void*                        pNext;
		(VkDeviceCreateFlags)0,						// VkDeviceCreateFlags                flags;
		static_cast<deUint32>(queueInfos.size()),	// uint32_t                           queueCreateInfoCount;
		&queueInfos[0],								// const VkDeviceQueueCreateInfo*     pQueueCreateInfos;
		0u,											// uint32_t                           enabledLayerCount;
		DE_NULL,									// const char* const*                 ppEnabledLayerNames;
		0u,											// uint32_t                           enabledExtensionCount;
		DE_NULL,									// const char* const*                 ppEnabledExtensionNames;
		&deviceFeatures,							// const VkPhysicalDeviceFeatures*    pEnabledFeatures;
	};

	m_logicalDevice = createDevice(instance, physicalDevice, &deviceInfo);
	m_deviceDriver	= de::MovePtr<DeviceDriver>(new DeviceDriver(instance, *m_logicalDevice));
	m_allocator		= de::MovePtr<Allocator>(new SimpleAllocator(*m_deviceDriver, *m_logicalDevice, getPhysicalDeviceMemoryProperties(instance, physicalDevice)));

	for (QueuesMap::iterator queuesIter = m_queues.begin(); queuesIter != m_queues.end(); ++queuesIter)
	{
		for (deUint32 queueNdx = 0u; queueNdx < queuesIter->second.size(); ++queueNdx)
		{
			Queue& queue = queuesIter->second[queueNdx];

			queue.queueHandle = getDeviceQueue(*m_deviceDriver, *m_logicalDevice, queue.queueFamilyIndex, queue.queueIndex);
		}
	}
}